

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void duckdb_je_b0_dalloc_tcache_stack(tsdn_t *tsdn,void *tcache_stack)

{
  base_t *base;
  base_t *tsdn_00;
  edata_t *edata;
  
  base = *(base_t **)((long)tcache_stack + -0x10);
  switchD_014c69ad::default((base->ehooks).ptr.repr,0,*(size_t *)&base->ehooks_base);
  tsdn_00 = b0;
  malloc_mutex_lock(tsdn,&b0->mtx);
  base_edata_heap_insert((tsdn_t *)tsdn_00,base,edata);
  (tsdn_00->mtx).field_0.field_0.locked.repr = false;
  pthread_mutex_unlock((pthread_mutex_t *)((long)&(tsdn_00->mtx).field_0 + 0x48));
  return;
}

Assistant:

void
b0_dalloc_tcache_stack(tsdn_t *tsdn, void *tcache_stack) {
	/* edata_t pointer stored in header. */
	size_t alignment, header_size;
	b0_alloc_header_size(&header_size, &alignment);

	edata_t *edata = *(edata_t **)((byte_t *)tcache_stack - header_size);
	void *addr = edata_addr_get(edata);
	size_t bsize = edata_bsize_get(edata);
	/* Marked as "reused" to avoid double counting stats. */
	assert(base_edata_is_reused(edata));
	assert(addr != NULL && bsize > 0);

	/* Zero out since base_alloc returns zeroed memory. */
	memset(addr, 0, bsize);

	base_t *base = b0get();
	malloc_mutex_lock(tsdn, &base->mtx);
	base_edata_heap_insert(tsdn, base, edata);
	malloc_mutex_unlock(tsdn, &base->mtx);
}